

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

OBJ_INDEX_DATA * get_obj_index(int vnum)

{
  int in_EDI;
  OBJ_INDEX_DATA *pObjIndex;
  undefined4 in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  OBJ_INDEX_DATA *pOVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  for (pOVar1 = obj_index_hash[in_EDI % 0x400]; pOVar1 != (OBJ_INDEX_DATA *)0x0;
      pOVar1 = pOVar1->next) {
    if (pOVar1->vnum == in_EDI) {
      return pOVar1;
    }
  }
  if (!fBootDb) {
    return (OBJ_INDEX_DATA *)0x0;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_EDI,in_stack_fffffffffffffff0),(char *)0x0);
  CLogger::Error<int&>
            ((CLogger *)CONCAT44(vnum,in_stack_00000018),(string_view)in_stack_00000020,
             (int *)pObjIndex);
  exit(1);
}

Assistant:

OBJ_INDEX_DATA *get_obj_index(int vnum)
{
	OBJ_INDEX_DATA *pObjIndex;

	for (pObjIndex = obj_index_hash[vnum % MAX_KEY_HASH]; pObjIndex != nullptr; pObjIndex = pObjIndex->next)
	{
		if (pObjIndex->vnum == vnum)
			return pObjIndex;
	}

	if (fBootDb)
	{
		RS.Logger.Error("Get_obj_index: bad vnum {}.", vnum);
		exit(1);
	}

	return nullptr;
}